

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8_dec.c
# Opt level: O1

int VP8GetHeaders(VP8Decoder *dec,VP8Io *io)

{
  VP8BitReader *br;
  int iVar1;
  byte bVar2;
  uint3 uVar3;
  bool bVar4;
  int8_t iVar5;
  uint8_t uVar6;
  uint32_t uVar7;
  int iVar9;
  VP8StatusCode VVar10;
  char *pcVar11;
  ulong uVar12;
  byte bVar13;
  int iVar14;
  byte bVar15;
  int iVar16;
  long lVar17;
  ulong uVar18;
  uint3 *start;
  int32_t iVar8;
  
  if (dec == (VP8Decoder *)0x0) {
    return 0;
  }
  dec->status_ = VP8_STATUS_OK;
  dec->error_msg_ = "OK";
  if (io == (VP8Io *)0x0) {
    dec->status_ = VP8_STATUS_INVALID_PARAM;
    pcVar11 = "null VP8Io passed to VP8GetHeaders()";
  }
  else {
    uVar18 = io->data_size;
    if (uVar18 < 4) {
      dec->status_ = VP8_STATUS_NOT_ENOUGH_DATA;
      pcVar11 = "Truncated header.";
    }
    else {
      start = (uint3 *)io->data;
      bVar2 = (byte)*start;
      uVar3 = *start;
      (dec->frm_hdr_).key_frame_ = bVar2 & 1 ^ 1;
      bVar15 = bVar2 >> 1 & 7;
      (dec->frm_hdr_).profile_ = bVar15;
      bVar13 = bVar2 >> 4 & 1;
      (dec->frm_hdr_).show_ = bVar13;
      (dec->frm_hdr_).partition_length_ = (uint)(uVar3 >> 5);
      if (bVar15 < 4) {
        if (bVar13 == 0) {
          dec->status_ = VP8_STATUS_UNSUPPORTED_FEATURE;
          dec->ready_ = 0;
          pcVar11 = "Frame not displayable.";
          goto LAB_0010b426;
        }
        start = (uint3 *)((long)start + 3);
        uVar18 = uVar18 - 3;
        bVar4 = true;
      }
      else {
        dec->status_ = VP8_STATUS_BITSTREAM_ERROR;
        dec->ready_ = 0;
        pcVar11 = "Incorrect keyframe parameters.";
LAB_0010b426:
        dec->error_msg_ = pcVar11;
        bVar4 = false;
      }
      if (!bVar4) {
        return 0;
      }
      if ((bVar2 & 1) == 0) {
        if (uVar18 < 7) {
          if (dec->status_ != VP8_STATUS_OK) {
            return 0;
          }
          dec->status_ = VP8_STATUS_NOT_ENOUGH_DATA;
          pcVar11 = "cannot parse picture header";
        }
        else {
          if ((((byte)*start == 0x9d) && (*(byte *)((long)start + 1) == 1)) &&
             (*(byte *)((long)start + 2) == 0x2a)) {
            bVar2 = *(byte *)((long)start + 3);
            iVar14 = ((byte)start[1] & 0x3f) * 0x100;
            iVar9 = iVar14 + (uint)bVar2;
            (dec->pic_hdr_).width_ = (uint16_t)iVar9;
            (dec->pic_hdr_).xscale_ = (byte)start[1] >> 6;
            bVar13 = *(byte *)((long)start + 5);
            iVar16 = (*(byte *)((long)start + 6) & 0x3f) * 0x100;
            iVar1 = iVar16 + (uint)bVar13;
            (dec->pic_hdr_).height_ = (uint16_t)iVar1;
            (dec->pic_hdr_).yscale_ = *(byte *)((long)start + 6) >> 6;
            start = (uint3 *)((long)start + 7);
            uVar18 = uVar18 - 7;
            dec->mb_w_ = iVar14 + (uint)bVar2 + 0xf >> 4;
            dec->mb_h_ = iVar16 + (uint)bVar13 + 0xf >> 4;
            io->width = iVar9;
            io->height = iVar1;
            io->use_cropping = 0;
            io->crop_left = 0;
            io->crop_top = 0;
            io->crop_right = iVar9;
            io->crop_bottom = iVar1;
            io->use_scaling = 0;
            io->scaled_width = iVar9;
            io->scaled_height = iVar1;
            io->mb_w = iVar9;
            io->mb_h = iVar1;
            VP8ResetProba(&dec->proba_);
            (dec->segment_hdr_).use_segment_ = 0;
            (dec->segment_hdr_).update_map_ = 0;
            (dec->segment_hdr_).absolute_delta_ = 1;
            (dec->segment_hdr_).quantizer_[0] = '\0';
            (dec->segment_hdr_).quantizer_[1] = '\0';
            (dec->segment_hdr_).quantizer_[2] = '\0';
            (dec->segment_hdr_).quantizer_[3] = '\0';
            (dec->segment_hdr_).filter_strength_[0] = '\0';
            (dec->segment_hdr_).filter_strength_[1] = '\0';
            (dec->segment_hdr_).filter_strength_[2] = '\0';
            (dec->segment_hdr_).filter_strength_[3] = '\0';
            goto LAB_0010b552;
          }
          if (dec->status_ != VP8_STATUS_OK) {
            return 0;
          }
          dec->status_ = VP8_STATUS_BITSTREAM_ERROR;
          pcVar11 = "Bad code word";
        }
      }
      else {
LAB_0010b552:
        uVar12 = (ulong)(dec->frm_hdr_).partition_length_;
        if (uVar18 < uVar12) {
          if (dec->status_ != VP8_STATUS_OK) {
            return 0;
          }
          dec->status_ = VP8_STATUS_NOT_ENOUGH_DATA;
          pcVar11 = "bad partition length";
        }
        else {
          br = &dec->br_;
          VP8InitBitReader(br,(uint8_t *)start,uVar12);
          uVar12 = (ulong)(dec->frm_hdr_).partition_length_;
          if ((dec->frm_hdr_).key_frame_ != '\0') {
            uVar7 = VP8GetValue(br,1);
            (dec->pic_hdr_).colorspace_ = (uint8_t)uVar7;
            uVar7 = VP8GetValue(br,1);
            (dec->pic_hdr_).clamp_type_ = (uint8_t)uVar7;
          }
          uVar7 = VP8GetValue(br,1);
          (dec->segment_hdr_).use_segment_ = uVar7;
          if (uVar7 == 0) {
            (dec->segment_hdr_).update_map_ = 0;
          }
          else {
            uVar7 = VP8GetValue(br,1);
            (dec->segment_hdr_).update_map_ = uVar7;
            uVar7 = VP8GetValue(br,1);
            if (uVar7 != 0) {
              uVar7 = VP8GetValue(br,1);
              (dec->segment_hdr_).absolute_delta_ = uVar7;
              lVar17 = 0;
              do {
                uVar7 = VP8GetValue(br,1);
                if (uVar7 == 0) {
                  iVar5 = '\0';
                }
                else {
                  iVar8 = VP8GetSignedValue(br,7);
                  iVar5 = (int8_t)iVar8;
                }
                (dec->segment_hdr_).quantizer_[lVar17] = iVar5;
                lVar17 = lVar17 + 1;
              } while (lVar17 != 4);
              lVar17 = 0;
              do {
                uVar7 = VP8GetValue(br,1);
                if (uVar7 == 0) {
                  iVar5 = '\0';
                }
                else {
                  iVar8 = VP8GetSignedValue(br,6);
                  iVar5 = (int8_t)iVar8;
                }
                (dec->segment_hdr_).filter_strength_[lVar17] = iVar5;
                lVar17 = lVar17 + 1;
              } while (lVar17 != 4);
            }
            if ((dec->segment_hdr_).update_map_ != 0) {
              lVar17 = -3;
              do {
                uVar7 = VP8GetValue(br,1);
                if (uVar7 == 0) {
                  uVar6 = 0xff;
                }
                else {
                  uVar7 = VP8GetValue(br,8);
                  uVar6 = (uint8_t)uVar7;
                }
                (dec->proba_).bands_[0][0].probas_[0][lVar17] = uVar6;
                lVar17 = lVar17 + 1;
              } while (lVar17 != 0);
            }
          }
          if ((dec->br_).eof_ == 0) {
            iVar9 = ParseFilterHeader(br,dec);
            if (iVar9 == 0) {
              if (dec->status_ != VP8_STATUS_OK) {
                return 0;
              }
              dec->status_ = VP8_STATUS_BITSTREAM_ERROR;
              pcVar11 = "cannot parse filter header";
            }
            else {
              VVar10 = ParsePartitions(dec,(byte *)((long)start + uVar12),uVar18 - uVar12);
              if (VVar10 == VP8_STATUS_OK) {
                VP8ParseQuant(dec);
                if ((dec->frm_hdr_).key_frame_ != '\0') {
                  iVar9 = 1;
                  VP8GetValue(br,1);
                  VP8ParseProba(br,dec);
                  goto LAB_0010b3a4;
                }
                if (dec->status_ != VP8_STATUS_OK) {
                  return 0;
                }
                dec->status_ = VP8_STATUS_UNSUPPORTED_FEATURE;
                pcVar11 = "Not a key frame.";
              }
              else {
                if (dec->status_ != VP8_STATUS_OK) {
                  return 0;
                }
                dec->status_ = VVar10;
                pcVar11 = "cannot parse partitions";
              }
            }
          }
          else {
            if (dec->status_ != VP8_STATUS_OK) {
              return 0;
            }
            dec->status_ = VP8_STATUS_BITSTREAM_ERROR;
            pcVar11 = "cannot parse segment header";
          }
        }
      }
    }
  }
  dec->error_msg_ = pcVar11;
  iVar9 = 0;
LAB_0010b3a4:
  dec->ready_ = iVar9;
  return iVar9;
}

Assistant:

int VP8GetHeaders(VP8Decoder* const dec, VP8Io* const io) {
  const uint8_t* buf;
  size_t buf_size;
  VP8FrameHeader* frm_hdr;
  VP8PictureHeader* pic_hdr;
  VP8BitReader* br;
  VP8StatusCode status;

  if (dec == NULL) {
    return 0;
  }
  SetOk(dec);
  if (io == NULL) {
    return VP8SetError(dec, VP8_STATUS_INVALID_PARAM,
                       "null VP8Io passed to VP8GetHeaders()");
  }
  buf = io->data;
  buf_size = io->data_size;
  if (buf_size < 4) {
    return VP8SetError(dec, VP8_STATUS_NOT_ENOUGH_DATA,
                       "Truncated header.");
  }

  // Paragraph 9.1
  {
    const uint32_t bits = buf[0] | (buf[1] << 8) | (buf[2] << 16);
    frm_hdr = &dec->frm_hdr_;
    frm_hdr->key_frame_ = !(bits & 1);
    frm_hdr->profile_ = (bits >> 1) & 7;
    frm_hdr->show_ = (bits >> 4) & 1;
    frm_hdr->partition_length_ = (bits >> 5);
    if (frm_hdr->profile_ > 3) {
      return VP8SetError(dec, VP8_STATUS_BITSTREAM_ERROR,
                         "Incorrect keyframe parameters.");
    }
    if (!frm_hdr->show_) {
      return VP8SetError(dec, VP8_STATUS_UNSUPPORTED_FEATURE,
                         "Frame not displayable.");
    }
    buf += 3;
    buf_size -= 3;
  }

  pic_hdr = &dec->pic_hdr_;
  if (frm_hdr->key_frame_) {
    // Paragraph 9.2
    if (buf_size < 7) {
      return VP8SetError(dec, VP8_STATUS_NOT_ENOUGH_DATA,
                         "cannot parse picture header");
    }
    if (!VP8CheckSignature(buf, buf_size)) {
      return VP8SetError(dec, VP8_STATUS_BITSTREAM_ERROR,
                         "Bad code word");
    }
    pic_hdr->width_ = ((buf[4] << 8) | buf[3]) & 0x3fff;
    pic_hdr->xscale_ = buf[4] >> 6;   // ratio: 1, 5/4 5/3 or 2
    pic_hdr->height_ = ((buf[6] << 8) | buf[5]) & 0x3fff;
    pic_hdr->yscale_ = buf[6] >> 6;
    buf += 7;
    buf_size -= 7;

    dec->mb_w_ = (pic_hdr->width_ + 15) >> 4;
    dec->mb_h_ = (pic_hdr->height_ + 15) >> 4;

    // Setup default output area (can be later modified during io->setup())
    io->width = pic_hdr->width_;
    io->height = pic_hdr->height_;
    // IMPORTANT! use some sane dimensions in crop_* and scaled_* fields.
    // So they can be used interchangeably without always testing for
    // 'use_cropping'.
    io->use_cropping = 0;
    io->crop_top  = 0;
    io->crop_left = 0;
    io->crop_right  = io->width;
    io->crop_bottom = io->height;
    io->use_scaling  = 0;
    io->scaled_width = io->width;
    io->scaled_height = io->height;

    io->mb_w = io->width;   // for soundness
    io->mb_h = io->height;  // ditto

    VP8ResetProba(&dec->proba_);
    ResetSegmentHeader(&dec->segment_hdr_);
  }

  // Check if we have all the partition #0 available, and initialize dec->br_
  // to read this partition (and this partition only).
  if (frm_hdr->partition_length_ > buf_size) {
    return VP8SetError(dec, VP8_STATUS_NOT_ENOUGH_DATA,
                       "bad partition length");
  }

  br = &dec->br_;
  VP8InitBitReader(br, buf, frm_hdr->partition_length_);
  buf += frm_hdr->partition_length_;
  buf_size -= frm_hdr->partition_length_;

  if (frm_hdr->key_frame_) {
    pic_hdr->colorspace_ = VP8Get(br, "global-header");
    pic_hdr->clamp_type_ = VP8Get(br, "global-header");
  }
  if (!ParseSegmentHeader(br, &dec->segment_hdr_, &dec->proba_)) {
    return VP8SetError(dec, VP8_STATUS_BITSTREAM_ERROR,
                       "cannot parse segment header");
  }
  // Filter specs
  if (!ParseFilterHeader(br, dec)) {
    return VP8SetError(dec, VP8_STATUS_BITSTREAM_ERROR,
                       "cannot parse filter header");
  }
  status = ParsePartitions(dec, buf, buf_size);
  if (status != VP8_STATUS_OK) {
    return VP8SetError(dec, status, "cannot parse partitions");
  }

  // quantizer change
  VP8ParseQuant(dec);

  // Frame buffer marking
  if (!frm_hdr->key_frame_) {
    return VP8SetError(dec, VP8_STATUS_UNSUPPORTED_FEATURE,
                       "Not a key frame.");
  }

  VP8Get(br, "global-header");   // ignore the value of update_proba_

  VP8ParseProba(br, dec);

  // sanitized state
  dec->ready_ = 1;
  return 1;
}